

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall QTableViewPrivate::init(QTableViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  QTableCornerButton *pQVar1;
  void *pvVar2;
  QHeaderView *pQVar3;
  QWidget *this_00;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  QSlotObjectBase local_60;
  void *local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QAbstractItemView::setEditTriggers
            ((QAbstractItemView *)parent,
             (EditTriggers)
             ((this->super_QAbstractItemViewPrivate).editTriggers.
              super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
              super_QFlagsStorage<QAbstractItemView::EditTrigger>.i | 0x10));
  pQVar3 = (QHeaderView *)operator_new(0x28);
  QHeaderView::QHeaderView(pQVar3,Vertical,parent);
  QHeaderView::setSectionsClickable(pQVar3,true);
  QHeaderView::setHighlightSections(pQVar3,true);
  QTableView::setVerticalHeader((QTableView *)parent,pQVar3);
  pQVar3 = (QHeaderView *)operator_new(0x28);
  QHeaderView::QHeaderView(pQVar3,Horizontal,parent);
  QHeaderView::setSectionsClickable(pQVar3,true);
  QHeaderView::setHighlightSections(pQVar3,true);
  QTableView::setHorizontalHeader((QTableView *)parent,pQVar3);
  (this->super_QAbstractItemViewPrivate).tabKeyNavigation = true;
  this_00 = (QWidget *)operator_new(0x28);
  QAbstractButton::QAbstractButton((QAbstractButton *)this_00,parent);
  *(undefined ***)this_00 = &PTR_metaObject_0080f2a8;
  *(undefined ***)&this_00->super_QPaintDevice = &PTR__QTableCornerButton_0080f470;
  this->cornerWidget = (QTableCornerButton *)this_00;
  QWidget::setFocusPolicy(this_00,NoFocus);
  pQVar1 = this->cornerWidget;
  local_60.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x229;
  local_60._4_4_ = 0;
  local_60.m_impl = (ImplFn)0x0;
  local_48 = QAbstractButton::clicked;
  local_40 = 0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QCallableObject<void_(QAbstractItemView::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar4 + 4) = 0x229;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_50,(void **)pQVar1,(QObject *)&local_48,(void **)parent,&local_60,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  pvVar2 = (this->cornerWidgetConnection).d_ptr;
  (this->cornerWidgetConnection).d_ptr = local_50;
  local_50 = pvVar2;
  QMetaObject::Connection::~Connection((Connection *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::init()
{
    Q_Q(QTableView);

    q->setEditTriggers(editTriggers|QAbstractItemView::AnyKeyPressed);

    QHeaderView *vertical = new QHeaderView(Qt::Vertical, q);
    vertical->setSectionsClickable(true);
    vertical->setHighlightSections(true);
    q->setVerticalHeader(vertical);

    QHeaderView *horizontal = new QHeaderView(Qt::Horizontal, q);
    horizontal->setSectionsClickable(true);
    horizontal->setHighlightSections(true);
    q->setHorizontalHeader(horizontal);

    tabKeyNavigation = true;

#if QT_CONFIG(abstractbutton)
    cornerWidget = new QTableCornerButton(q);
    cornerWidget->setFocusPolicy(Qt::NoFocus);
    cornerWidgetConnection = QObject::connect(
          cornerWidget, &QTableCornerButton::clicked,
          q, &QTableView::selectAll);
#endif
}